

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::binary_go<long,long_double>
          (Boxed_Number *this,Opers t_oper,long *t,longdouble *u,Boxed_Value *t_lhs)

{
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  longdouble lVar1;
  Boxed_Value BVar2;
  
  switch(t_oper) {
  case assign:
    lVar1 = *u;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  case assign_product:
    lVar1 = (longdouble)*t * *u;
    break;
  case assign_sum:
    lVar1 = (longdouble)*t + *u;
    break;
  case assign_quotient:
    lVar1 = (longdouble)*t / *u;
    break;
  case assign_difference:
    lVar1 = (longdouble)*t - *u;
  }
  *t = (long)ROUND(lVar1);
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_lhs);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }